

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O0

expr_node * __thiscall expr_tree::arctanDeriv(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  expr_node *peVar2;
  expr_node *this_00;
  expr_node *frac;
  expr_node *sum;
  expr_node *square;
  expr_node *in_stack_ffffffffffffff78;
  expr_value local_68;
  expr_value local_60;
  expr_node *local_58;
  expr_value local_50;
  expr_value local_48;
  expr_node *local_40;
  expr_value local_38 [3];
  expr_value local_20;
  expr_node *local_18;
  
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_20,5);
  peVar2 = Copy(in_stack_ffffffffffffff78);
  this_00 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)local_38,2);
  expr_node::expr_node(this_00,'\x01',local_38);
  expr_node::expr_node(peVar1,'\x05',&local_20,(expr_node *)0x0,peVar2,this_00);
  local_18 = peVar1;
  Link(peVar1,peVar1->left,peVar1->right);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_48,1);
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_50,1);
  expr_node::expr_node(peVar2,'\x01',&local_50);
  expr_node::expr_node(peVar1,'\x05',&local_48,(expr_node *)0x0,peVar2,local_18);
  local_40 = peVar1;
  Link(peVar1,peVar1->left,peVar1->right);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_60,4);
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value((expr_value *)&local_68,1);
  expr_node::expr_node(peVar2,'\x01',&local_68);
  expr_node::expr_node(peVar1,'\x05',&local_60,(expr_node *)0x0,peVar2,local_40);
  local_58 = peVar1;
  Link(peVar1,peVar1->left,peVar1->right);
  return local_58;
}

Assistant:

expr_node* expr_tree::arctanDeriv(const expr_node* node)
{
    auto square = new expr_node(OP, (long)PWR, nullptr, Copy(node->right), new expr_node(INT, (long)2));
    Link(square, square->left, square->right);
    auto sum = new expr_node(OP, (long)ADD, nullptr, new expr_node(INT, (long)1), square);
    Link(sum, sum->left, sum->right);
    auto frac = new expr_node(OP, (long)DIV, nullptr, new expr_node(INT, (long)1), sum);
    Link(frac, frac->left, frac->right);
    return frac;
}